

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

FT_Error t1_builder_start_point(T1_Builder builder,FT_Pos x,FT_Pos y)

{
  FT_Error FVar1;
  
  FVar1 = 0;
  if (builder->parse_state != T1_Parse_Have_Path) {
    builder->parse_state = T1_Parse_Have_Path;
    FVar1 = t1_builder_add_contour(builder);
    if (FVar1 == 0) {
      FVar1 = t1_builder_add_point1(builder,x,y);
      return FVar1;
    }
  }
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  t1_builder_start_point( T1_Builder  builder,
                          FT_Pos      x,
                          FT_Pos      y )
  {
    FT_Error  error = FT_ERR( Invalid_File_Format );


    /* test whether we are building a new contour */

    if ( builder->parse_state == T1_Parse_Have_Path )
      error = FT_Err_Ok;
    else
    {
      builder->parse_state = T1_Parse_Have_Path;
      error = t1_builder_add_contour( builder );
      if ( !error )
        error = t1_builder_add_point1( builder, x, y );
    }

    return error;
  }